

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::truncate
          (ArrayBuilder<kj::Exception::Detail> *this,char *__file,__off_t __length)

{
  Detail *pDVar1;
  Detail *pDVar2;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  pDVar1 = this->ptr;
  while (pDVar2 = this->pos, pDVar1 + (long)__file < pDVar2) {
    this->pos = pDVar2 + -1;
    Array<unsigned_char>::~Array(&pDVar2[-1].value);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }